

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

void __thiscall cfd::Psbt::Psbt(Psbt *this,uint32_t psbt_version,TransactionContext *context)

{
  _Rb_tree_header *p_Var1;
  pointer pTVar2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_5b8;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> local_598;
  OutPoint local_580;
  UtxoData local_558;
  
  core::Transaction::Transaction((Transaction *)&local_558,&context->super_Transaction);
  core::Psbt::Psbt(&this->super_Psbt,psbt_version,(Transaction *)&local_558);
  core::Transaction::~Transaction((Transaction *)&local_558);
  (this->super_Psbt)._vptr_Psbt = (_func_int **)&PTR__Psbt_00880d90;
  p_Var1 = &(this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->verify_ignore_map_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_5b8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5b8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_5b8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  core::Transaction::GetTxInList(&local_598,&context->super_Transaction);
  if (local_598.
      super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_598.
      super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pTVar2 = local_598.
             super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      core::OutPoint::OutPoint
                (&local_580,&(pTVar2->super_AbstractTxInReference).txid_,
                 (pTVar2->super_AbstractTxInReference).vout_);
      TransactionContext::GetTxInUtxoData(&local_558,context,&local_580);
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::emplace_back<cfd::UtxoData>
                (&local_5b8,&local_558);
      UtxoData::~UtxoData(&local_558);
      local_580.txid_._vptr_Txid = (_func_int **)&PTR__Txid_0087c9b8;
      if (local_580.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_580.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_580.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_580.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pTVar2 = pTVar2 + 1;
    } while (pTVar2 != local_598.
                       super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
            (&local_598);
  CollectInputUtxo(this,&local_5b8);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_5b8);
  return;
}

Assistant:

Psbt::Psbt(uint32_t psbt_version, const TransactionContext& context)
    : cfd::core::Psbt(psbt_version, static_cast<const Transaction>(context)) {
  std::vector<UtxoData> utxo_list;
  for (const auto& txin : context.GetTxInList()) {
    utxo_list.push_back(context.GetTxInUtxoData(txin.GetOutPoint()));
  }
  CollectInputUtxo(utxo_list);
}